

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall spirv_cross::ParsedIR::unset_decoration(ParsedIR *this,ID id,Decoration decoration)

{
  mapped_type *pmVar1;
  TypedID<(spirv_cross::Types)0> local_34;
  uint32_t *local_30;
  uint32_t *counter;
  Decoration *dec;
  ParsedIR *pPStack_18;
  Decoration decoration_local;
  ParsedIR *this_local;
  ID id_local;
  
  dec._4_4_ = decoration;
  pPStack_18 = this;
  this_local._4_4_ = id.id;
  counter = (uint32_t *)
            ::std::
            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
            ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
  Bitset::clear(&(((mapped_type *)counter)->decoration).decoration_flags,dec._4_4_);
  if (dec._4_4_ == DecorationSpecId) {
    counter[0x3c] = 0;
  }
  else if (dec._4_4_ == DecorationBuiltIn) {
    *(undefined1 *)(counter + 0x3f) = 0;
  }
  else if (dec._4_4_ == DecorationStream) {
    counter[0x38] = 0;
  }
  else if (dec._4_4_ == DecorationLocation) {
    counter[0x31] = 0;
  }
  else if (dec._4_4_ == DecorationComponent) {
    counter[0x32] = 0;
  }
  else if (dec._4_4_ == DecorationBinding) {
    counter[0x34] = 0;
  }
  else if (dec._4_4_ == DecorationDescriptorSet) {
    counter[0x33] = 0;
  }
  else if (dec._4_4_ == DecorationOffset) {
    counter[0x35] = 0;
  }
  else if (dec._4_4_ == DecorationXfbBuffer) {
    counter[0x36] = 0;
  }
  else if (dec._4_4_ == DecorationXfbStride) {
    counter[0x37] = 0;
  }
  else if (dec._4_4_ == DecorationFPRoundingMode) {
    counter[0x3e] = 0x7fffffff;
  }
  else if (dec._4_4_ == DecorationInputAttachmentIndex) {
    counter[0x3b] = 0;
  }
  else if (dec._4_4_ == DecorationCounterBuffer) {
    pmVar1 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
    local_30 = &pmVar1->hlsl_magic_counter_buffer;
    if (*local_30 != 0) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_34,*local_30);
      pmVar1 = ::std::
               unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
               ::operator[](&this->meta,&local_34);
      pmVar1->hlsl_is_magic_counter_buffer = false;
      *local_30 = 0;
    }
  }
  else if (dec._4_4_ == DecorationHlslSemanticGOOGLE) {
    ::std::__cxx11::string::clear();
  }
  return;
}

Assistant:

void ParsedIR::unset_decoration(ID id, Decoration decoration)
{
	auto &dec = meta[id].decoration;
	dec.decoration_flags.clear(decoration);
	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = false;
		break;

	case DecorationLocation:
		dec.location = 0;
		break;

	case DecorationComponent:
		dec.component = 0;
		break;

	case DecorationOffset:
		dec.offset = 0;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = 0;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = 0;
		break;

	case DecorationStream:
		dec.stream = 0;
		break;

	case DecorationBinding:
		dec.binding = 0;
		break;

	case DecorationDescriptorSet:
		dec.set = 0;
		break;

	case DecorationInputAttachmentIndex:
		dec.input_attachment = 0;
		break;

	case DecorationSpecId:
		dec.spec_id = 0;
		break;

	case DecorationHlslSemanticGOOGLE:
		dec.hlsl_semantic.clear();
		break;

	case DecorationFPRoundingMode:
		dec.fp_rounding_mode = FPRoundingModeMax;
		break;

	case DecorationHlslCounterBufferGOOGLE:
	{
		auto &counter = meta[id].hlsl_magic_counter_buffer;
		if (counter)
		{
			meta[counter].hlsl_is_magic_counter_buffer = false;
			counter = 0;
		}
		break;
	}

	default:
		break;
	}
}